

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialog::QColorDialog(QColorDialog *this,QColor *initial,QWidget *parent)

{
  QColorDialogPrivate *pQVar1;
  QWidget *in_RSI;
  QDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QColorDialogPrivate *d;
  QDialogPrivate *dd;
  undefined4 in_stack_fffffffffffffff0;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  dd = in_RDI;
  pQVar1 = (QColorDialogPrivate *)operator_new(0x3b0);
  QColorDialogPrivate::QColorDialogPrivate(pQVar1);
  QDialog::QDialog((QDialog *)CONCAT44(0x8003003,in_stack_fffffffffffffff0),dd,in_RSI,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)lVar2 >> 0x20,0));
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR_metaObject_00d20f28;
  *(undefined ***)&(in_RDI->super_QWidgetPrivate).field_0x10 = &PTR__QColorDialog_00d21100;
  pQVar1 = d_func((QColorDialog *)0x73998b);
  QColorDialogPrivate::init(pQVar1,(EVP_PKEY_CTX *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QColorDialog::QColorDialog(const QColor &initial, QWidget *parent)
    : QDialog(*new QColorDialogPrivate, parent, qcd_DefaultWindowFlags)
{
    Q_D(QColorDialog);
    d->init(initial);
}